

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_policy.cpp
# Opt level: O1

ACT_TYPE __thiscall
despot::ModeStatePolicy::Action
          (ModeStatePolicy *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  State *pSVar1;
  pointer pdVar2;
  int iVar3;
  pointer ppSVar4;
  ulong uVar5;
  State *pSVar6;
  double dVar7;
  double dVar8;
  
  ppSVar4 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
      super__Vector_impl_data._M_finish == ppSVar4) {
    pSVar6 = (State *)0x0;
  }
  else {
    uVar5 = 0;
    pSVar6 = (State *)0x0;
    dVar7 = 0.0;
    do {
      pSVar1 = ppSVar4[uVar5];
      iVar3 = (*this->indexer_->_vptr_StateIndexer[3])(this->indexer_,pSVar1);
      pdVar2 = (this->state_probs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar8 = pSVar1->weight + pdVar2[iVar3];
      pdVar2[iVar3] = dVar8;
      if (dVar8 <= dVar7) {
        dVar8 = dVar7;
        pSVar1 = pSVar6;
      }
      pSVar6 = pSVar1;
      uVar5 = uVar5 + 1;
      ppSVar4 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      dVar7 = dVar8;
    } while (uVar5 < (ulong)((long)(particles->
                                   super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4 >> 3)
            );
  }
  ppSVar4 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppSVar4) {
    uVar5 = 0;
    do {
      iVar3 = (*this->indexer_->_vptr_StateIndexer[3])(this->indexer_,ppSVar4[uVar5]);
      (this->state_probs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar3] = 0.0;
      uVar5 = uVar5 + 1;
      ppSVar4 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(particles->
                                   super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4 >> 3)
            );
  }
  if (pSVar6 != (State *)0x0) {
    iVar3 = (*this->policy_->_vptr_StatePolicy[2])(this->policy_,pSVar6);
    return iVar3;
  }
  __assert_fail("mode != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/core/builtin_policy.cpp"
                ,0x8b,
                "virtual ACT_TYPE despot::ModeStatePolicy::Action(const vector<State *> &, RandomStreams &, History &) const"
               );
}

Assistant:

ACT_TYPE ModeStatePolicy::Action(const vector<State*>& particles,
	RandomStreams& streams, History& history) const {
	double maxWeight = 0;
	State* mode = NULL;
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		int id = indexer_.GetIndex(particle);
		state_probs_[id] += particle->weight;

		if (state_probs_[id] > maxWeight) {
			maxWeight = state_probs_[id];
			mode = particle;
		}
	}

	for (int i = 0; i < particles.size(); i++) {
		state_probs_[indexer_.GetIndex(particles[i])] = 0;
	}

	assert(mode != NULL);
	return policy_.GetAction(*mode);
}